

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBidec.c
# Opt level: O0

uint * Gia_ManConvertAigToTruth
                 (Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vTruth,
                 Vec_Int_t *vVisited)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int Entry;
  Gia_Obj_t *pGVar5;
  uint *pOut;
  uint *pIn;
  bool bVar6;
  int nVars;
  int nWords;
  int i;
  uint *pTruth;
  Vec_Ptr_t *vTtElems;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVisited_local;
  Vec_Int_t *vTruth_local;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  pTruth = (uint *)0x0;
  iVar2 = Vec_IntSize(vLeaves);
  iVar3 = Abc_TruthWordNum(iVar2);
  pGVar5 = Gia_Regular(pRoot);
  iVar4 = Gia_ObjIsConst0(pGVar5);
  if (iVar4 == 0) {
    if (8 < iVar2) {
      pTruth = (uint *)Vec_PtrAllocTruthTables(iVar2);
    }
    Vec_IntClear(vTruth);
    Vec_IntClear(vVisited);
    nVars = 0;
    while( true ) {
      iVar4 = Vec_IntSize(vLeaves);
      bVar6 = false;
      if (nVars < iVar4) {
        iVar4 = Vec_IntEntry(vLeaves,nVars);
        vTtElems = (Vec_Ptr_t *)Gia_ManObj(p,iVar4);
        bVar6 = vTtElems != (Vec_Ptr_t *)0x0;
      }
      if (!bVar6) break;
      pOut = Vec_IntFetch(vTruth,iVar3);
      if (pTruth == (uint *)0x0) {
        Gia_ManTruthCopy(pOut,Gia_ManConvertAigToTruth::uTruths[nVars],iVar2);
      }
      else {
        pIn = (uint *)Vec_PtrEntry((Vec_Ptr_t *)pTruth,nVars);
        Gia_ManTruthCopy(pOut,pIn,iVar2);
      }
      pVVar1 = p->vTruths;
      iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vTtElems);
      Entry = Vec_IntSize(vVisited);
      Vec_IntSetEntry(pVVar1,iVar4,Entry);
      iVar4 = Gia_ObjId(p,(Gia_Obj_t *)vTtElems);
      Vec_IntPush(vVisited,iVar4);
      nVars = nVars + 1;
    }
    if (pTruth != (uint *)0x0) {
      Vec_PtrFree((Vec_Ptr_t *)pTruth);
    }
    pGVar5 = Gia_Regular(pRoot);
    p_local = (Gia_Man_t *)Gia_ManConvertAigToTruth_rec(p,pGVar5,vTruth,iVar3,vVisited);
    iVar3 = Gia_IsComplement(pRoot);
    if (iVar3 != 0) {
      Gia_ManTruthNot((uint *)p_local,(uint *)p_local,iVar2);
    }
    nVars = 0;
    while( true ) {
      iVar2 = Vec_IntSize(vVisited);
      bVar6 = false;
      if (nVars < iVar2) {
        iVar2 = Vec_IntEntry(vVisited,nVars);
        vTtElems = (Vec_Ptr_t *)Gia_ManObj(p,iVar2);
        bVar6 = vTtElems != (Vec_Ptr_t *)0x0;
      }
      if (!bVar6) break;
      pVVar1 = p->vTruths;
      iVar2 = Gia_ObjId(p,(Gia_Obj_t *)vTtElems);
      Vec_IntSetEntry(pVVar1,iVar2,-1);
      nVars = nVars + 1;
    }
  }
  else {
    Vec_IntClear(vTruth);
    p_local = (Gia_Man_t *)Vec_IntFetch(vTruth,iVar3);
    iVar3 = Gia_IsComplement(pRoot);
    if (iVar3 == 0) {
      Gia_ManTruthClear((uint *)p_local,iVar2);
    }
    else {
      Gia_ManTruthFill((uint *)p_local,iVar2);
    }
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Gia_ManConvertAigToTruth( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vTruth, Vec_Int_t * vVisited )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    Gia_Obj_t * pObj;
    Vec_Ptr_t * vTtElems = NULL;
    unsigned * pTruth;//, * pTruth2;
    int i, nWords, nVars;
    // get the number of variables and words
    nVars  = Vec_IntSize( vLeaves );
    nWords = Abc_TruthWordNum( nVars );
    // check the case of a constant
    if ( Gia_ObjIsConst0( Gia_Regular(pRoot) ) )
    {
        Vec_IntClear( vTruth );
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        if ( !Gia_IsComplement(pRoot) )
            Gia_ManTruthClear( pTruth, nVars );
        else
            Gia_ManTruthFill( pTruth, nVars );
        return pTruth;
    }
    // if the number of variables is more than 8, allocate truth tables
    if ( nVars > 8 )
        vTtElems = Vec_PtrAllocTruthTables( nVars );
    // assign elementary truth tables
    Vec_IntClear( vTruth );
    Vec_IntClear( vVisited );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        // get room for the truth table
        pTruth = Vec_IntFetch( vTruth, nWords );
        // assign elementary variable
        if ( vTtElems )
            Gia_ManTruthCopy( pTruth, (unsigned *)Vec_PtrEntry(vTtElems, i), nVars );
        else
            Gia_ManTruthCopy( pTruth, uTruths[i], nVars );
        // save the visited node
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), Vec_IntSize(vVisited) );
        Vec_IntPush( vVisited, Gia_ObjId(p, pObj) );
    }
    if ( vTtElems )
        Vec_PtrFree( vTtElems );
    // clear the marks and compute the truth table
//    pTruth2 = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    pTruth = Gia_ManConvertAigToTruth_rec( p, Gia_Regular(pRoot), vTruth, nWords, vVisited );
    // copy the result
//    Gia_ManTruthCopy( pTruth, pTruth2, nVars );
    if ( Gia_IsComplement(pRoot) )
        Gia_ManTruthNot( pTruth, pTruth, nVars );
    // clean truth tables
    Gia_ManForEachObjVec( vVisited, p, pObj, i )
        Vec_IntSetEntry( p->vTruths, Gia_ObjId(p, pObj), -1 );
    return pTruth;
}